

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_93(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle oh1;
  QPDFObjectHandle oh4;
  QPDFObjectHandle oh2;
  QPDFObjectHandle trailer;
  QPDFObjectHandle oh3;
  QPDFObjectHandle root2;
  QPDFObjectHandle root1;
  QPDFObjectHandle local_c0;
  long local_b0 [2];
  QPDFObjectHandle local_a0;
  element_type local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFObjectHandle local_50;
  char local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  QPDFObjectHandle local_20;
  
  QPDF::getTrailer();
  local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/Root","");
  QPDFObjectHandle::getKey((string *)&local_20);
  if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_b0) {
    operator_delete(local_c0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_b0[0] + 1);
  }
  QPDF::getRoot();
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_20);
  if (cVar1 == '\0') {
    __assert_fail("root1.isSameObjectAs(root2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcc8,"void test_93(QPDF &, const char *)");
  }
  operator____qpdf((char *)&local_a0,0x14bfc1);
  local_80 = local_a0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78 = local_a0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_a0);
  if (cVar1 == '\0') {
    __assert_fail("oh1.isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xccb,"void test_93(QPDF &, const char *)");
  }
  operator____qpdf(local_40,0x14bfc1);
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_a0);
  if (cVar1 != '\0') {
    __assert_fail("!oh1.isSameObjectAs(oh3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xccd,"void test_93(QPDF &, const char *)");
  }
  local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/One","");
  operator____qpdf((char *)local_90,0x14b8a6);
  QPDFObjectHandle::replaceKey((string *)&local_80,&local_c0);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_b0) {
    operator_delete(local_c0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_b0[0] + 1);
  }
  cVar1 = QPDFObjectHandle::isSameObjectAs(&local_a0);
  if (cVar1 == '\0') {
    __assert_fail("oh1.isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xccf,"void test_93(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_c0);
  if (iVar2 != 0) {
    __assert_fail("oh2.unparse() == \"<< /One /Three >>\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd0,"void test_93(QPDF &, const char *)");
  }
  if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_b0) {
    operator_delete(local_c0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_b0[0] + 1);
  }
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 == '\0') {
    local_60 = local_a0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58 = local_a0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_90;
    QPDF::makeIndirectObject(QVar3);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    cVar1 = QPDFObjectHandle::isSameObjectAs(&local_a0);
    if (cVar1 == '\0') {
      __assert_fail("oh1.isSameObjectAs(oh4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xcd3,"void test_93(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isIndirect();
    if (cVar1 == '\0') {
      __assert_fail("oh1.isIndirect()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xcd4,"void test_93(QPDF &, const char *)");
    }
    cVar1 = QPDFObjectHandle::isIndirect();
    if (cVar1 != '\0') {
      local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/Potato","");
      QPDFObjectHandle::replaceKey(local_70,&local_c0);
      if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_b0) {
        operator_delete(local_c0.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_b0[0] + 1);
      }
      local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/Potato","");
      QPDFObjectHandle::getKey((string *)&local_50);
      cVar1 = QPDFObjectHandle::isSameObjectAs(&local_50);
      if (cVar1 != '\0') {
        if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)local_b0) {
          operator_delete(local_c0.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_b0[0] + 1);
        }
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        }
        if (local_20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_20.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        return;
      }
      __assert_fail("trailer.getKey(\"/Potato\").isSameObjectAs(oh2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xcd7,"void test_93(QPDF &, const char *)");
    }
    __assert_fail("oh4.isIndirect()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd5,"void test_93(QPDF &, const char *)");
  }
  __assert_fail("!oh1.isIndirect()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xcd1,"void test_93(QPDF &, const char *)");
}

Assistant:

static void
test_93(QPDF& pdf, char const* arg2)
{
    // Test QPDFObjectHandle equality. Two QPDFObjectHandle objects
    // are equal if they point to the same underlying object.

    auto trailer = pdf.getTrailer();
    auto root1 = trailer.getKey("/Root");
    auto root2 = pdf.getRoot();
    assert(root1.isSameObjectAs(root2));
    auto oh1 = "<< /One /Two >>"_qpdf;
    auto oh2 = oh1;
    assert(oh1.isSameObjectAs(oh2));
    auto oh3 = "<< /One /Two >>"_qpdf;
    assert(!oh1.isSameObjectAs(oh3));
    oh2.replaceKey("/One", "/Three"_qpdf);
    assert(oh1.isSameObjectAs(oh2));
    assert(oh2.unparse() == "<< /One /Three >>");
    assert(!oh1.isIndirect());
    auto oh4 = pdf.makeIndirectObject(oh1);
    assert(oh1.isSameObjectAs(oh4));
    assert(oh1.isIndirect());
    assert(oh4.isIndirect());
    trailer.replaceKey("/Potato", oh1);
    assert(trailer.getKey("/Potato").isSameObjectAs(oh2));
}